

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_alignment.cpp
# Opt level: O0

void get_max_sizes(Am_Value_List *components,int *max_width,int *max_height)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  int height;
  int width;
  Am_Object local_28;
  Am_Object item;
  int *max_height_local;
  int *max_width_local;
  Am_Value_List *components_local;
  
  *max_width = 0;
  *max_height = 0;
  item.data = (Am_Object_Data *)max_height;
  Am_Object::Am_Object(&local_28);
  Am_Value_List::Start(components);
  while (bVar1 = Am_Value_List::Last(components), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar4 = Am_Value_List::Get(components);
    Am_Object::operator=(&local_28,pAVar4);
    pAVar4 = Am_Object::Get(&local_28,0x69,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar4);
    if (bVar1) {
      pAVar4 = Am_Object::Get(&local_28,0x66,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar4 = Am_Object::Get(&local_28,0x67,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      if (*max_width < iVar2) {
        *max_width = iVar2;
      }
      if (*(int *)&((item.data)->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type
          < iVar3) {
        *(int *)&((item.data)->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
             iVar3;
      }
    }
    Am_Value_List::Next(components);
  }
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

void
get_max_sizes(Am_Value_List &components, int &max_width, int &max_height)
{
  max_width = 0;
  max_height = 0;
  Am_Object item;
  for (components.Start(); !components.Last(); components.Next()) {
    item = components.Get();
    if ((bool)item.Get(Am_VISIBLE)) {
      int width = item.Get(Am_WIDTH);
      int height = item.Get(Am_HEIGHT);
      if (width > max_width)
        max_width = width;
      if (height > max_height)
        max_height = height;
    }
  }
}